

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void probability_sort(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint uVar1;
  uint *puVar2;
  uint *x;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  unsigned_long *puVar4;
  uint *puVar5;
  unsigned_long uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  long lVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> elems;
  allocator_type local_49;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  local_30;
  
  _Var3 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  uVar1 = *_Var3._M_current;
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  vector((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> *
         )&local_30,(ulong)(uVar1 + 1),(allocator_type *)&local_48);
  puVar4 = &(local_30._M_impl.super__Vector_impl_data._M_start)->second;
  for (uVar6 = 0;
      (long)local_30._M_impl.super__Vector_impl_data._M_finish -
      (long)local_30._M_impl.super__Vector_impl_data._M_start >> 4 != uVar6; uVar6 = uVar6 + 1) {
    *puVar4 = uVar6;
    ((pair<long,_unsigned_long> *)(puVar4 + -1))->first = 0;
    puVar4 = puVar4 + 2;
  }
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    local_30._M_impl.super__Vector_impl_data._M_start[*puVar5].first =
         local_30._M_impl.super__Vector_impl_data._M_start[*puVar5].first + -1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_long>*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(ulong)(uVar1 + 1),
             &local_49);
  puVar4 = &(local_30._M_impl.super__Vector_impl_data._M_start)->second;
  for (lVar7 = 0;
      (long)local_30._M_impl.super__Vector_impl_data._M_finish -
      (long)local_30._M_impl.super__Vector_impl_data._M_start >> 4 != lVar7; lVar7 = lVar7 + 1) {
    uVar6 = *puVar4;
    puVar4 = puVar4 + 2;
    local_48._M_impl.super__Vector_impl_data._M_start[uVar6] = (uint)lVar7;
  }
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    *puVar5 = local_48._M_impl.super__Vector_impl_data._M_start[*puVar5] + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  std::
  _Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  ~_Vector_base(&local_30);
  return;
}

Assistant:

void probability_sort(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<std::pair<int64_t, uint64_t>> elems(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        elems[i].second = i;
        elems[i].first = 0;
    }
    for (const auto& v : vec)
        elems[v].first--;
    std::sort(elems.begin(), elems.end());
    std::vector<uint32_t> remap(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        remap[elems[i].second] = i;
    }
    for (auto& x : vec)
        x = remap[x] + 1;
}